

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

void slang::ast::SemanticFacts::populateTimeScale
               (TimeScale *timeScale,Scope *scope,TimeUnitsDeclarationSyntax *syntax,
               optional<slang::SourceRange> *unitsRange,optional<slang::SourceRange> *precisionRange
               ,bool isFirst)

{
  Token *pTVar1;
  DividerClauseSyntax *pDVar2;
  Token token;
  strong_ordering sVar3;
  Diagnostic *this;
  Info *pIVar4;
  undefined8 uVar5;
  Token token_00;
  bool errored;
  anon_class_24_3_c5d18a8a handle;
  bool local_42;
  bool local_41;
  anon_class_24_3_c5d18a8a local_40;
  
  local_40.isFirst = &local_41;
  local_40.errored = &local_42;
  local_42 = false;
  pTVar1 = &syntax->time;
  uVar5._0_2_ = pTVar1->kind;
  uVar5._2_1_ = pTVar1->field_0x2;
  uVar5._3_1_ = pTVar1->numFlags;
  uVar5._4_4_ = pTVar1->rawLen;
  pIVar4 = (syntax->time).info;
  token.kind = pTVar1->kind;
  token._2_1_ = pTVar1->field_0x2;
  token.numFlags.raw = (pTVar1->numFlags).raw;
  token.rawLen = pTVar1->rawLen;
  token.info = pTVar1->info;
  local_41 = isFirst;
  local_40.scope = scope;
  if ((syntax->keyword).kind == TimeUnitKeyword) {
    populateTimeScale::anon_class_24_3_c5d18a8a::operator()
              (&local_40,token,unitsRange,&timeScale->base);
    pDVar2 = syntax->divider;
    if (pDVar2 == (DividerClauseSyntax *)0x0) goto LAB_002f5cfa;
    uVar5._0_2_ = (pDVar2->value).kind;
    uVar5._2_1_ = (pDVar2->value).field_0x2;
    uVar5._3_1_ = (pDVar2->value).numFlags;
    uVar5._4_4_ = (pDVar2->value).rawLen;
    pIVar4 = (pDVar2->value).info;
  }
  token_00.info = pIVar4;
  token_00.kind = (short)uVar5;
  token_00._2_1_ = (char)((ulong)uVar5 >> 0x10);
  token_00.numFlags.raw = (char)((ulong)uVar5 >> 0x18);
  token_00.rawLen = (int)((ulong)uVar5 >> 0x20);
  populateTimeScale::anon_class_24_3_c5d18a8a::operator()
            (&local_40,token_00,precisionRange,&timeScale->precision);
LAB_002f5cfa:
  if (((local_42 == false) &&
      ((unitsRange->super__Optional_base<slang::SourceRange,_true,_true>)._M_payload.
       super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) &&
     ((precisionRange->super__Optional_base<slang::SourceRange,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
    sVar3 = TimeScaleValue::operator<=>(&timeScale->precision,&timeScale->base);
    if ('\0' < sVar3._M_value) {
      this = Scope::addDiag(scope,(DiagCode)0xe0004,
                            (precisionRange->super__Optional_base<slang::SourceRange,_true,_true>).
                            _M_payload.super__Optional_payload_base<slang::SourceRange>._M_payload.
                            _M_value);
      Diagnostic::operator<<
                (this,(unitsRange->super__Optional_base<slang::SourceRange,_true,_true>)._M_payload.
                      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value);
    }
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(TimeScale& timeScale, const Scope& scope,
                                      const TimeUnitsDeclarationSyntax& syntax,
                                      std::optional<SourceRange>& unitsRange,
                                      std::optional<SourceRange>& precisionRange, bool isFirst) {
    bool errored = false;
    auto handle = [&](Token token, std::optional<SourceRange>& prevRange, TimeScaleValue& value) {
        // If there were syntax errors just bail out, diagnostics have already been issued.
        if (token.isMissing() || token.kind != TokenKind::TimeLiteral)
            return;

        auto val = TimeScaleValue::fromLiteral(token.realValue(), token.numericFlags().unit());
        if (!val) {
            scope.addDiag(diag::InvalidTimeScaleSpecifier, token.location());
            return;
        }

        if (prevRange) {
            // If the value was previously set, we need to make sure this new
            // value is exactly the same, otherwise we error.
            if (value != *val && !errored) {
                auto& diag = scope.addDiag(diag::MismatchedTimeScales, token.range());
                diag.addNote(diag::NotePreviousDefinition, *prevRange);
                errored = true;
            }
        }
        else {
            // The first time scale declarations must be the first elements in the parent scope.
            if (!isFirst && !errored) {
                scope.addDiag(diag::TimeScaleFirstInScope, token.range());
                errored = true;
            }

            value = *val;
            prevRange = token.range();
        }
    };

    if (syntax.keyword.kind == TokenKind::TimeUnitKeyword) {
        handle(syntax.time, unitsRange, timeScale.base);
        if (syntax.divider)
            handle(syntax.divider->value, precisionRange, timeScale.precision);
    }
    else {
        handle(syntax.time, precisionRange, timeScale.precision);
    }

    if (!errored && unitsRange && precisionRange && timeScale.precision > timeScale.base) {
        auto& diag = scope.addDiag(diag::InvalidTimeScalePrecision, *precisionRange);
        diag << *unitsRange;
    }
}